

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# min_max_operations.c
# Opt level: O1

int32_t WebRtcSpl_MaxAbsValueW32C(int32_t *vector,size_t length)

{
  uint uVar1;
  size_t sVar2;
  uint uVar3;
  uint uVar4;
  
  if (length != 0) {
    sVar2 = 0;
    uVar3 = 0;
    do {
      uVar1 = vector[sVar2];
      uVar4 = -uVar1;
      if (0 < (int)uVar1) {
        uVar4 = uVar1;
      }
      if (uVar4 <= uVar3) {
        uVar4 = uVar3;
      }
      uVar3 = uVar4;
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
    uVar1 = 0x7fffffff;
    if (uVar3 < 0x7fffffff) {
      uVar1 = uVar3;
    }
    return uVar1;
  }
  __assert_fail("length > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/signal_processing/min_max_operations.c"
                ,0x43,"int32_t WebRtcSpl_MaxAbsValueW32C(const int32_t *, size_t)");
}

Assistant:

int32_t WebRtcSpl_MaxAbsValueW32C(const int32_t* vector, size_t length) {
  // Use uint32_t for the local variables, to accommodate the return value
  // of abs(0x80000000), which is 0x80000000.

  uint32_t absolute = 0, maximum = 0;
  size_t i = 0;

  assert(length > 0);

  for (i = 0; i < length; i++) {
    absolute = abs((int)vector[i]);
    if (absolute > maximum) {
      maximum = absolute;
    }
  }

  maximum = WEBRTC_SPL_MIN(maximum, WEBRTC_SPL_WORD32_MAX);

  return (int32_t)maximum;
}